

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogLuvInitState(TIFF *tif)

{
  uint8_t *puVar1;
  int iVar2;
  tmsize_t tVar3;
  void *pvVar4;
  LogLuvState *sp;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  if (puVar1 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x5ac,"int LogLuvInitState(TIFF *)");
  }
  if ((tif->tif_dir).td_photometric == 0x804d) {
    if ((tif->tif_dir).td_planarconfig == 1) {
      if (*(int *)(puVar1 + 4) == -1) {
        iVar2 = LogLuvGuessDataFmt(&tif->tif_dir);
        *(int *)(puVar1 + 4) = iVar2;
      }
      switch(*(undefined4 *)(puVar1 + 4)) {
      case 0:
        puVar1[0xc] = '\f';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        break;
      case 1:
        puVar1[0xc] = '\x06';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        break;
      case 2:
        puVar1[0xc] = '\x04';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        break;
      case 3:
        puVar1[0xc] = '\x03';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        break;
      default:
        TIFFErrorExtR(tif,"LogLuvInitState","No support for converting user data format to LogLuv");
        return 0;
      }
      if ((tif->tif_flags & 0x400) == 0) {
        if ((tif->tif_dir).td_rowsperstrip < (tif->tif_dir).td_imagelength) {
          tVar3 = multiply_ms((ulong)(tif->tif_dir).td_imagewidth,
                              (ulong)(tif->tif_dir).td_rowsperstrip);
          *(tmsize_t *)(puVar1 + 0x18) = tVar3;
        }
        else {
          tVar3 = multiply_ms((ulong)(tif->tif_dir).td_imagewidth,
                              (ulong)(tif->tif_dir).td_imagelength);
          *(tmsize_t *)(puVar1 + 0x18) = tVar3;
        }
      }
      else {
        tVar3 = multiply_ms((ulong)(tif->tif_dir).td_tilewidth,(ulong)(tif->tif_dir).td_tilelength);
        *(tmsize_t *)(puVar1 + 0x18) = tVar3;
      }
      tVar3 = multiply_ms(*(tmsize_t *)(puVar1 + 0x18),4);
      if (tVar3 != 0) {
        pvVar4 = _TIFFmallocExt(tif,*(long *)(puVar1 + 0x18) << 2);
        *(void **)(puVar1 + 0x10) = pvVar4;
        if (pvVar4 != (void *)0x0) {
          return 1;
        }
      }
      TIFFErrorExtR(tif,"LogLuvInitState","No space for SGILog translation buffer");
    }
    else {
      TIFFErrorExtR(tif,"LogLuvInitState","SGILog compression cannot handle non-contiguous data");
    }
    return 0;
  }
  __assert_fail("td->td_photometric == PHOTOMETRIC_LOGLUV",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                ,0x5ad,"int LogLuvInitState(TIFF *)");
}

Assistant:

static int LogLuvInitState(TIFF *tif)
{
    static const char module[] = "LogLuvInitState";
    TIFFDirectory *td = &tif->tif_dir;
    LogLuvState *sp = DecoderState(tif);

    assert(sp != NULL);
    assert(td->td_photometric == PHOTOMETRIC_LOGLUV);

    /* for some reason, we can't do this in TIFFInitLogLuv */
    if (td->td_planarconfig != PLANARCONFIG_CONTIG)
    {
        TIFFErrorExtR(tif, module,
                      "SGILog compression cannot handle non-contiguous data");
        return (0);
    }
    if (sp->user_datafmt == SGILOGDATAFMT_UNKNOWN)
        sp->user_datafmt = LogLuvGuessDataFmt(td);
    switch (sp->user_datafmt)
    {
        case SGILOGDATAFMT_FLOAT:
            sp->pixel_size = 3 * sizeof(float);
            break;
        case SGILOGDATAFMT_16BIT:
            sp->pixel_size = 3 * sizeof(int16_t);
            break;
        case SGILOGDATAFMT_RAW:
            sp->pixel_size = sizeof(uint32_t);
            break;
        case SGILOGDATAFMT_8BIT:
            sp->pixel_size = 3 * sizeof(uint8_t);
            break;
        default:
            TIFFErrorExtR(
                tif, module,
                "No support for converting user data format to LogLuv");
            return (0);
    }
    if (isTiled(tif))
        sp->tbuflen = multiply_ms(td->td_tilewidth, td->td_tilelength);
    else if (td->td_rowsperstrip < td->td_imagelength)
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_rowsperstrip);
    else
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_imagelength);
    if (multiply_ms(sp->tbuflen, sizeof(uint32_t)) == 0 ||
        (sp->tbuf = (uint8_t *)_TIFFmallocExt(
             tif, sp->tbuflen * sizeof(uint32_t))) == NULL)
    {
        TIFFErrorExtR(tif, module, "No space for SGILog translation buffer");
        return (0);
    }
    return (1);
}